

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

pair<const_int,_int> * __thiscall
frozen::bits::LowerBound<int,frozen::impl::CompareKey<std::less<int>>>::
doitfirst<std::pair<int_const,int>const*,8ul>
          (LowerBound<int,frozen::impl::CompareKey<std::less<int>>> *this,long first)

{
  int iVar1;
  pair<const_int,_int> *ppVar2;
  long lVar3;
  
  iVar1 = **(int **)this;
  if (*(int *)(first + 0x18) < iVar1) {
    ppVar2 = doitfirst<std::pair<int_const,int>const*,4ul>(this,first + 0x20);
    return ppVar2;
  }
  lVar3 = (ulong)(*(int *)(first + 8) < iVar1) * 0x10;
  return (pair<const_int,_int> *)(first + lVar3 + (ulong)(*(int *)(first + lVar3) < iVar1) * 8);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }